

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

bool __thiscall BinGE<0,_4,_0>::propagate(BinGE<0,_4,_0> *this)

{
  int iVar1;
  IntVar *pIVar2;
  long lVar3;
  bool bVar4;
  IntVar *pIVar5;
  long lVar6;
  int64_t m_v;
  long lVar7;
  
  pIVar2 = (this->x).var;
  pIVar5 = (this->y).var;
  lVar6 = (long)(pIVar2->max).v;
  lVar3 = (long)(this->y).b;
  lVar7 = (pIVar5->min).v + lVar3;
  if ((pIVar2->min).v < lVar7) {
    if (so.lazy) {
      iVar1 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[8])();
      lVar3 = (long)iVar1 * 4 + 2;
      pIVar2 = (this->x).var;
    }
    else {
      lVar3 = 0;
    }
    iVar1 = (*(pIVar2->super_Var).super_Branching._vptr_Branching[0xe])(pIVar2,lVar7,lVar3,1);
    if ((char)iVar1 != '\0') {
      pIVar5 = (this->y).var;
      lVar3 = (long)(this->y).b;
      goto LAB_00190b6d;
    }
LAB_00190be9:
    bVar4 = false;
  }
  else {
LAB_00190b6d:
    lVar7 = (pIVar5->max).v + lVar3;
    if (lVar6 < lVar7) {
      if (so.lazy == true) {
        iVar1 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
        lVar7 = (long)iVar1 * 4 + 2;
        lVar3 = (long)(this->y).b;
        pIVar5 = (this->y).var;
      }
      else {
        lVar7 = 0;
      }
      iVar1 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar5,lVar6 - lVar3,lVar7,1);
      if ((char)iVar1 == '\0') goto LAB_00190be9;
      lVar7 = (long)(this->y).b + (long)(((this->y).var)->max).v;
    }
    bVar4 = true;
    if (lVar7 <= (((this->x).var)->min).v) {
      Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
    }
  }
  return bVar4;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}